

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  pointer *__ptr;
  char *pcVar6;
  double dVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  Paraglob p;
  Paraglob sp;
  undefined1 local_158 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  undefined1 local_130 [112];
  double local_c0;
  undefined1 local_b8 [112];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (argc < 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"usage: ");
    poVar3 = std::operator<<(poVar3,*argv);
    std::operator<<(poVar3," -n <text> <patterns>\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"       ");
    std::operator<<(poVar3,"Prints the number of patterns that match the text.\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"       ");
    poVar3 = std::operator<<(poVar3,*argv);
    std::operator<<(poVar3," -b <a> <b> <c> <time>\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"       ");
    std::operator<<(poVar3,"Benchmark. a - n patterns. b - n queries. c - % matches.\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"       ");
    poVar3 = std::operator<<(poVar3,*argv);
    std::operator<<(poVar3," -s <patterns>\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"       ");
    std::operator<<(poVar3,"Prints a a paraglob with **patterns** serialization\n");
    exit(1);
  }
  pcVar6 = argv[1];
  if (*pcVar6 == '-') {
    if ((pcVar6[1] == 'b') && (pcVar6[2] == '\0')) {
      local_c0 = 0.0;
      if (argc == 6) {
        local_c0 = atof(argv[5]);
      }
      dVar7 = benchmark(argv[2],argv[3],argv[4],(bool)(-(local_c0 != 0.0) & 1));
      if (local_c0 <= 0.0) {
        return 0;
      }
      if (dVar7 <= local_c0) {
        pcVar6 = "Passed.\n";
      }
      else {
        pcVar6 = "Failed.\n";
      }
      lVar4 = 8;
      goto LAB_00103827;
    }
    if ((pcVar6[1] != 'n') || (pcVar6[2] != '\0')) {
      if ((pcVar6[1] == 's') && (pcVar6[2] == '\0')) {
        local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (3 < (uint)argc) {
          uVar5 = 3;
          do {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_130,argv[uVar5],(allocator<char> *)local_b8);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130);
            if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
              operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
            }
            uVar5 = uVar5 + 1;
          } while ((uint)argc != uVar5);
        }
        paraglob::Paraglob::Paraglob((Paraglob *)local_130,&local_148);
        paraglob::Paraglob::serialize((Paraglob *)local_158);
        paraglob::Paraglob::Paraglob
                  ((Paraglob *)local_b8,
                   (unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)local_158);
        if ((AhoCorasickPlus *)local_158._0_8_ != (AhoCorasickPlus *)0x0) {
          std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
          operator()((default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                     local_158,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158._0_8_);
        }
        local_158._0_8_ =
             (__uniq_ptr_impl<AhoCorasickPlus,_std::default_delete<AhoCorasickPlus>_>)0x0;
        bVar1 = paraglob::Paraglob::operator==((Paraglob *)local_130,(Paraglob *)local_b8);
        pcVar6 = "failed";
        if (bVar1) {
          pcVar6 = "passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,6);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
        std::ostream::put(-0x78);
        std::ostream::flush();
        paraglob::Paraglob::~Paraglob((Paraglob *)local_b8);
        goto LAB_00103bf8;
      }
      goto LAB_00103804;
    }
    local_148.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (3 < (uint)argc) {
      uVar5 = 3;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_130,argv[uVar5],(allocator<char> *)local_b8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
        if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
          operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
        }
        uVar5 = uVar5 + 1;
      } while ((uint)argc != uVar5);
    }
    paraglob::Paraglob::Paraglob((Paraglob *)local_130,&local_148);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b8,argv[2],(allocator<char> *)(local_158 + 0xf));
    paraglob::Paraglob::get(&local_48,(Paraglob *)local_130,(string *)local_b8);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    paraglob::Paraglob::str_abi_cxx11_((string *)local_b8,(Paraglob *)local_130);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_b8._0_8_,local_b8._8_8_);
    if ((undefined1 *)local_b8._0_8_ == local_b8 + 0x10) goto LAB_00103bf8;
  }
  else {
LAB_00103804:
    iVar2 = strcmp(pcVar6,"-str");
    if (iVar2 != 0) {
      pcVar6 = "Unrecognized first param\n";
      lVar4 = 0x19;
LAB_00103827:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar4);
      return 0;
    }
    local_148.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (3 < (uint)argc) {
      uVar5 = 3;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_130,argv[uVar5],(allocator<char> *)local_b8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
        if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
          operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
        }
        uVar5 = uVar5 + 1;
      } while ((uint)argc != uVar5);
    }
    paraglob::Paraglob::Paraglob((Paraglob *)local_130,&local_148);
    paraglob::Paraglob::str_abi_cxx11_((string *)local_b8,(Paraglob *)local_130);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_b8._0_8_,local_b8._8_8_);
    if ((undefined1 *)local_b8._0_8_ == local_b8 + 0x10) goto LAB_00103bf8;
  }
  operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
LAB_00103bf8:
  paraglob::Paraglob::~Paraglob((Paraglob *)local_130);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	double max_time = 0;

	if (argc <= 1) {
		std::cerr << "usage: " << argv[0] << " -n <text> <patterns>\n";
		std::cerr << "       " <<
			"Prints the number of patterns that match the text.\n";
		std::cerr << "       " << argv[0] << " -b <a> <b> <c> <time>\n";
		std::cerr << "       " <<
			"Benchmark. a - n patterns. b - n queries. c - % matches.\n";
		std::cerr << "       " << argv[0] << " -s <patterns>\n";
		std::cerr << "       " <<
			"Prints a a paraglob with **patterns** serialization\n";
		exit(1);
	}

	if (strcmp(argv[1], "-b") == 0) {
		if (argc == 6) {
			// there is a time argument
			max_time = atof(argv[5]);
		}

		char* a = argv[2];
		char* b = argv[3];
		char* c = argv[4];
		double elapsed = benchmark(a, b, c, max_time);

		if (max_time > 0) {
			if (elapsed <= max_time) {
				std::cout << "Passed.\n";
			} else {
				std::cout << "Failed.\n";
			}
		}
	} else if (strcmp(argv[1], "-n") == 0) {
		std::vector<std::string> v;
		for (int i = 3 ; i < argc ; i++) {
			v.push_back(std::string(argv[i]));
		}
		paraglob::Paraglob p(v);
		std::cout << p.get(std::string(argv[2])).size() << "\n";
		std::cout << p.str();
	} else if (strcmp(argv[1], "-s") == 0) {
		std::vector<std::string> v;
		for (int i = 3 ; i < argc ; i++) {
			v.push_back(std::string(argv[i]));
		}
		try
			{
			paraglob::Paraglob p(v);
			paraglob::Paraglob sp(p.serialize());
			if (p == sp)
				std::cout << "passed" << std::endl;
			else
				std::cout << "failed" << std::endl;
			}
		catch(const paraglob::overflow_error &e)
			{
			std::cerr << e.what() << '\n';
			}
	}
	else if (strcmp(argv[1], "-str") == 0) {
		std::vector<std::string> v;
		for (int i = 3 ; i < argc ; i++) {
			v.push_back(std::string(argv[i]));
		}
		paraglob::Paraglob p(v);
		std::cout << p.str();
	}
	else {
		std::cout << "Unrecognized first param\n";
	}
}